

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

bool __thiscall slang::ast::AssertionExpr::admitsEmpty(AssertionExpr *this)

{
  bool bVar1;
  AdmitsEmpty AVar2;
  logic_error *this_00;
  long *plVar3;
  long lVar4;
  size_type *psVar5;
  long *plVar6;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  do {
    lVar4 = 0x18;
    switch((((SimpleAssertionExpr *)this)->super_AssertionExpr).kind) {
    case Invalid:
    case Unary:
    case StrongWeak:
    case Abort:
    case Conditional:
    case Case:
    case DisableIff:
      return false;
    case Simple:
      bVar1 = SimpleAssertionExpr::admitsEmptyImpl((SimpleAssertionExpr *)this);
      return bVar1;
    case SequenceConcat:
      bVar1 = SequenceConcatExpr::admitsEmptyImpl((SequenceConcatExpr *)this);
      return bVar1;
    case SequenceWithMatch:
      if ((((SimpleAssertionExpr *)this)->repetition).
          super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged != true) {
        return false;
      }
      AVar2 = SequenceRepetition::admitsEmpty
                        ((SequenceRepetition *)&((SimpleAssertionExpr *)this)->repetition);
      if (AVar2 != Yes) {
        return false;
      }
      return true;
    case Binary:
      bVar1 = BinaryAssertionExpr::admitsEmptyImpl((BinaryAssertionExpr *)this);
      return bVar1;
    case FirstMatch:
      lVar4 = 0x10;
      if (*(long *)((long)&(((SimpleAssertionExpr *)this)->repetition).
                           super__Optional_base<slang::ast::SequenceRepetition,_true,_true>.
                           _M_payload.super__Optional_payload_base<slang::ast::SequenceRepetition>.
                           _M_payload + 8) != 0) {
        return false;
      }
    case Clocking:
      this = *(AssertionExpr **)
              ((long)&(((SimpleAssertionExpr *)this)->super_AssertionExpr).kind + lVar4);
      break;
    default:
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
                 ,"");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_d0);
      local_b0._M_dataplus._M_p = (pointer)*plVar3;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar5) {
        local_b0.field_2._M_allocated_capacity = *psVar5;
        local_b0.field_2._8_8_ = plVar3[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar5;
      }
      local_b0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x199);
      std::operator+(&local_50,&local_b0,&local_70);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (long *)*plVar3;
      plVar6 = plVar3 + 2;
      if (local_90 == plVar6) {
        local_80 = *plVar6;
        lStack_78 = plVar3[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar6;
      }
      local_88 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_f0 = (long *)*plVar3;
      plVar6 = plVar3 + 2;
      if (local_f0 == plVar6) {
        local_e0 = *plVar6;
        lStack_d8 = plVar3[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar6;
      }
      local_e8 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  } while( true );
}

Assistant:

bool AssertionExpr::admitsEmpty() const {
    AdmitsEmptyVisitor visitor;
    return visit(visitor);
}